

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O0

void __thiscall QStackedLayout::hasHeightForWidth(QStackedLayout *this)

{
  QStackedLayout *in_stack_00000018;
  
  hasHeightForWidth(in_stack_00000018);
  return;
}

Assistant:

bool QStackedLayout::hasHeightForWidth() const
{
    const int n = count();

    for (int i = 0; i < n; ++i) {
        if (QLayoutItem *item = itemAt(i)) {
            if (item->hasHeightForWidth())
                return true;
        }
    }
    return false;
}